

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::JoinerType,unsigned_short>>
               (tuple<testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_short>_>
                *matchers,tuple<ot::commissioner::JoinerType,_unsigned_short> *values,ostream *os)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  int iVar2;
  ostream *poVar3;
  StringMatchResultListener listener;
  char *local_1e8;
  long local_1e0;
  char local_1d8 [16];
  undefined **local_1c8;
  undefined1 *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<ot::commissioner::JoinerType>,testing::Matcher<unsigned_short>>,std::tuple<ot::commissioner::JoinerType,unsigned_short>>
            (matchers,values,os);
  peVar1 = (matchers->
           super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_short>_>
           ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
           super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
           super_MatcherBase<unsigned_short>.impl_.
           super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  this = (matchers->
         super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_short>_>
         ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
         super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
         super_MatcherBase<unsigned_short>.impl_.
         super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  local_1c0 = local_1a8;
  local_1c8 = &PTR__StringMatchResultListener_0039fd18;
  std::__cxx11::stringstream::stringstream(local_1b8);
  iVar2 = (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[4])
                    (peVar1,values,&local_1c8);
  if ((char)iVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    peVar1 = (matchers->
             super__Tuple_impl<0UL,_testing::Matcher<ot::commissioner::JoinerType>,_testing::Matcher<unsigned_short>_>
             ).super__Tuple_impl<1UL,_testing::Matcher<unsigned_short>_>.
             super__Head_base<1UL,_testing::Matcher<unsigned_short>,_false>._M_head_impl.
             super_MatcherBase<unsigned_short>.impl_.
             super___shared_ptr<const_testing::MatcherInterface<const_unsigned_short_&>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (*(peVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(peVar1,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::string::compare((char *)&local_1e8);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,local_1e8,local_1e0);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c8 = &PTR__StringMatchResultListener_0039fd18;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }